

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::entry_point_args_argument_buffer_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,bool append_comma)

{
  bool bVar1;
  SPIRVariable *var;
  SPIRType *pSVar2;
  SPIREntryPoint *pSVar3;
  iterator iVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  uint32_t bit;
  undefined7 in_register_00000011;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_131;
  long local_130;
  undefined4 local_124;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Bitset claimed_bindings;
  
  local_124 = (undefined4)CONCAT71(in_register_00000011,append_comma);
  entry_point_arg_stage_in_abi_cxx11_(__return_storage_ptr__,this);
  claimed_bindings.lower = 0;
  claimed_bindings.higher._M_h._M_buckets = &claimed_bindings.higher._M_h._M_single_bucket;
  claimed_bindings.higher._M_h._M_bucket_count = 1;
  claimed_bindings.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  claimed_bindings.higher._M_h._M_element_count = 0;
  claimed_bindings.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  claimed_bindings.higher._M_h._M_rehash_policy._M_next_resize = 0;
  claimed_bindings.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b8 = &(this->resource_bindings)._M_h;
  local_c0 = &(this->recursive_inputs)._M_h;
  lVar7 = 0;
  while (lVar7 != 8) {
    uVar8 = this->argument_buffer_ids[lVar7];
    local_130 = lVar7;
    if (uVar8 != 0) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar8);
      var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar8);
      pSVar2 = Compiler::get_variable_data_type((Compiler *)this,var);
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pSVar3 = Compiler::get_entry_point((Compiler *)this);
      local_100._M_dataplus._M_p._0_4_ = pSVar3->model;
      local_100._M_dataplus._M_p._4_4_ = (undefined4)local_130;
      local_100._M_string_length._0_4_ = 0xfffffffc;
      iVar4 = ::std::
              _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_b8,(key_type *)&local_100);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        bVar1 = Bitset::get(&claimed_bindings,(uint32_t)local_130);
        bit = (uint32_t)local_130;
        if (bVar1) {
          bit = this->next_metal_resource_index_buffer;
        }
      }
      else {
        bit = *(uint32_t *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      ._M_cur + 0x28);
        *(undefined1 *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                ._M_cur + 0x34) = 1;
      }
      Bitset::set(&claimed_bindings,bit);
      get_argument_address_space_abi_cxx11_(&local_120,this,var);
      ::std::operator+(&local_100,&local_120," ");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string((string *)&local_120);
      local_100._M_dataplus._M_p._0_4_ = (pSVar2->super_IVariant).self.id;
      sVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_c0,(key_type *)&local_100);
      if (sVar5 == 0) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_b0,this,pSVar2,0);
        ::std::operator+(&local_e0,&local_b0,"& ");
        pcVar6 = to_restrict(this,uVar8,true);
        ::std::operator+(&local_120,&local_e0,pcVar6);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)uVar8);
        ::std::operator+(&local_100,&local_120,&local_90);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_120;
      }
      else {
        ::std::__cxx11::string::string((string *)&local_b0,"void* ",&local_131);
        pcVar6 = to_restrict(this,uVar8,true);
        ::std::operator+(&local_e0,&local_b0,pcVar6);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)uVar8);
        ::std::operator+(&local_120,&local_e0,&local_90);
        ::std::operator+(&local_100,&local_120,"_vp");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_120);
        this_00 = &local_90;
      }
      ::std::__cxx11::string::~string((string *)this_00);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::to_string(&local_e0,bit);
      ::std::operator+(&local_120," [[buffer(",&local_e0);
      ::std::operator+(&local_100,&local_120,")]]");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::__cxx11::string::~string((string *)&local_e0);
      uVar8 = bit + 1;
      if (bit + 1 < this->next_metal_resource_index_buffer) {
        uVar8 = this->next_metal_resource_index_buffer;
      }
      this->next_metal_resource_index_buffer = uVar8;
    }
    lVar7 = local_130 + 1;
  }
  entry_point_args_discrete_descriptors(this,__return_storage_ptr__);
  entry_point_args_builtin(this,__return_storage_ptr__);
  if ((char)local_124 == '\x01' && __return_storage_ptr__->_M_string_length != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&claimed_bindings.higher._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_args_argument_buffer(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	Bitset claimed_bindings;

	for (uint32_t i = 0; i < kMaxArgumentBuffers; i++)
	{
		uint32_t id = argument_buffer_ids[i];
		if (id == 0)
			continue;

		add_resource_name(id);
		auto &var = get<SPIRVariable>(id);
		auto &type = get_variable_data_type(var);

		if (!ep_args.empty())
			ep_args += ", ";

		// Check if the argument buffer binding itself has been remapped.
		uint32_t buffer_binding;
		auto itr = resource_bindings.find({ get_entry_point().model, i, kArgumentBufferBinding });
		if (itr != end(resource_bindings))
		{
			buffer_binding = itr->second.first.msl_buffer;
			itr->second.second = true;
		}
		else
		{
			// As a fallback, directly map desc set <-> binding.
			// If that was taken, take the next buffer binding.
			if (claimed_bindings.get(i))
				buffer_binding = next_metal_resource_index_buffer;
			else
				buffer_binding = i;
		}

		claimed_bindings.set(buffer_binding);

		ep_args += get_argument_address_space(var) + " ";

		if (recursive_inputs.count(type.self))
			ep_args += string("void* ") + to_restrict(id, true) + to_name(id) + "_vp";
		else
			ep_args += type_to_glsl(type) + "& " + to_restrict(id, true) + to_name(id);

		ep_args += " [[buffer(" + convert_to_string(buffer_binding) + ")]]";

		next_metal_resource_index_buffer = max(next_metal_resource_index_buffer, buffer_binding + 1);
	}

	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}